

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

string * __thiscall
Database::Last_abi_cxx11_(string *__return_storage_ptr__,Database *this,Date *date)

{
  bool bVar1;
  const_iterator cVar2;
  ostream *poVar3;
  ostringstream fmt;
  
  if (((this->storage)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (bVar1 = Date::operator>((Date *)((this->storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left + 1),date), !bVar1)) {
    cVar2 = std::
            _Rb_tree<Date,_std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::lower_bound((_Rb_tree<Date,_std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)this,date);
    if (((_Rb_tree_header *)cVar2._M_node == &(this->storage)._M_t._M_impl.super__Rb_tree_header) ||
       (bVar1 = Date::operator>((Date *)(cVar2._M_node + 1),date), bVar1)) {
      cVar2._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar2._M_node);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmt);
    poVar3 = operator<<((ostream *)&fmt,(Date *)(cVar2._M_node + 1));
    poVar3 = std::operator<<(poVar3,' ');
    std::operator<<(poVar3,(string *)(cVar2._M_node[1]._M_right + -1));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmt);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"No entries",(allocator<char> *)&fmt);
  return __return_storage_ptr__;
}

Assistant:

string Database::Last(const Date& date) const {
    if (storage.empty() || storage.begin()->first > date) {
        return "No entries";
    }

    auto it = storage.lower_bound(date);
    if (it == storage.end() || it->first > date) {
        --it;
    }

    ostringstream fmt;
    fmt << it->first << ' ' << it->second.back();

    return fmt.str();
}